

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polyline_shape.cc
# Opt level: O0

void __thiscall
S2LaxPolylineShape::S2LaxPolylineShape
          (S2LaxPolylineShape *this,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices_local;
  S2LaxPolylineShape *this_local;
  
  S2Shape::S2Shape(&this->super_S2Shape);
  (this->super_S2Shape)._vptr_S2Shape = (_func_int **)&PTR__S2LaxPolylineShape_0062e1a0;
  std::unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>>::
  unique_ptr<std::default_delete<Vector3<double>[]>,void>
            ((unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>> *)
             &this->vertices_);
  Init(this,vertices);
  return;
}

Assistant:

S2LaxPolylineShape::S2LaxPolylineShape(const vector<S2Point>& vertices) {
  Init(vertices);
}